

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtcTimeStampTestCase.cpp
# Opt level: O3

void __thiscall SuiteUtcTimeStampTests::Testsubtract::RunImpl(Testsubtract *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int local_30 [2];
  TestDetails local_28;
  
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30[1] = 0;
  local_30[0] = 0;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x4a);
  UnitTest::CheckEqual<int,int>(pTVar1,local_30 + 1,local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30[1] = 0xfffffff6;
  local_30[0] = -10;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x4b);
  UnitTest::CheckEqual<int,int>(pTVar1,local_30 + 1,local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30[1] = 0xfffffffb;
  local_30[0] = -5;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x4c);
  UnitTest::CheckEqual<int,int>(pTVar1,local_30 + 1,local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30[1] = 5;
  local_30[0] = 5;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x4e);
  UnitTest::CheckEqual<int,int>(pTVar1,local_30 + 1,local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30[1] = 0xfffffffb;
  local_30[0] = -5;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x4f);
  UnitTest::CheckEqual<int,int>(pTVar1,local_30 + 1,local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30[1] = 0;
  local_30[0] = 0;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x50);
  UnitTest::CheckEqual<int,int>(pTVar1,local_30 + 1,local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30[1] = 10;
  local_30[0] = 10;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x52);
  UnitTest::CheckEqual<int,int>(pTVar1,local_30 + 1,local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30[1] = 0;
  local_30[0] = 0;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x53);
  UnitTest::CheckEqual<int,int>(pTVar1,local_30 + 1,local_30,&local_28);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_30[1] = 5;
  local_30[0] = 5;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_28,*ppTVar3,0x54);
  UnitTest::CheckEqual<int,int>(pTVar1,local_30 + 1,local_30,&local_28);
  return;
}

Assistant:

TEST(subtract)
{
  UtcTimeStamp sm( 10, 10, 10, 10, 10, 2000 );
  UtcTimeStamp lg( 10, 10, 20, 10, 10, 2000 );
  UtcTimeStamp mid( 10, 10, 15, 10, 10, 2000 );

  CHECK_EQUAL( 0, ( sm - sm ) );
  CHECK_EQUAL( -10, ( sm - lg ) );
  CHECK_EQUAL( -5, ( sm - mid ) );

  CHECK_EQUAL( 5, ( mid - sm ) );
  CHECK_EQUAL( -5, ( mid - lg ) );
  CHECK_EQUAL( 0, ( mid - mid ) );

  CHECK_EQUAL( 10, ( lg - sm ) );
  CHECK_EQUAL( 0, ( lg - lg ) );
  CHECK_EQUAL( 5, ( lg - mid ) );
}